

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

bool __thiscall Mesh::loadObj(Mesh *this,string *filePath)

{
  MeshData MVar1;
  string local_48;
  allocator local_22;
  bool local_21 [8];
  bool succes;
  
  local_21[0] = false;
  std::__cxx11::string::string((string *)&local_48,(filePath->_M_dataplus)._M_p,&local_22);
  MVar1 = ObjLoader::loadOBJ(&local_48,local_21);
  this->meshData = MVar1;
  std::__cxx11::string::~string((string *)&local_48);
  return local_21[0];
}

Assistant:

bool Mesh::loadObj(std::string filePath)
{
	bool succes = false;
	meshData = ObjLoader::loadOBJ(filePath.c_str(), succes);
	return succes;

}